

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

Material * __thiscall embree::OBJMaterial::material(OBJMaterial *this)

{
  element_type *peVar1;
  long in_RDI;
  
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x108))
  ;
  *(element_type **)(in_RDI + 0xd0) = peVar1;
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x118))
  ;
  *(element_type **)(in_RDI + 0xd8) = peVar1;
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x128))
  ;
  *(element_type **)(in_RDI + 0xe0) = peVar1;
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x138))
  ;
  *(element_type **)(in_RDI + 0xe8) = peVar1;
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x148))
  ;
  *(element_type **)(in_RDI + 0xf0) = peVar1;
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x158))
  ;
  *(element_type **)(in_RDI + 0xf8) = peVar1;
  peVar1 = std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x168))
  ;
  *(element_type **)(in_RDI + 0x100) = peVar1;
  return (Material *)(in_RDI + 0x70);
}

Assistant:

virtual Material* material() 
    { 
      map_d = _map_d.get();
      map_Ka = _map_Ka.get();
      map_Kd = _map_Kd.get();
      map_Ks = _map_Ks.get();
      map_Kt = _map_Kt.get();
      map_Ns = _map_Ns.get();
      map_Displ = _map_Displ.get();
      return &base; 
    }